

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void __thiscall
EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn>::EasyUseDenseHashMap
          (EasyUseDenseHashMap<HashObject<8,_8>,_int,_HashFn> *this)

{
  HashObject<8,_8> *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_> *this_00;
  hasher *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  *in_stack_ffffffffffffffe0;
  libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_> local_b [11];
  
  this_00 = local_b;
  google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>::
  libc_allocator_with_realloc(this_00);
  google::
  dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::dense_hash_map(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                   (key_equal *)this_00,(allocator_type *)in_RDI);
  google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>::
  ~libc_allocator_with_realloc(local_b);
  HashObject<8,_8>::HashObject(in_RDI,in_stack_ffffffffffffffbc);
  google::
  dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::set_empty_key((dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                   *)in_RDI,
                  (key_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  HashObject<8,_8>::HashObject(in_RDI,in_stack_ffffffffffffffbc);
  google::
  dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::set_deleted_key((dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                     *)in_RDI,
                    (key_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

EasyUseDenseHashMap() {
    this->set_empty_key(-1);
    this->set_deleted_key(-2);
  }